

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::normal3d>
          (Attribute *this,double t,normal3d *dst,TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  optional<tinyusdz::value::normal3d> local_60 [2];
  
  if (dst != (normal3d *)0x0) {
    if (((NAN(t)) &&
        ((((this->_var)._blocked != false ||
          (pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0)) ||
         ((uVar2 = (*pvVar1->type_id)(), uVar2 != 0 &&
          ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
           (uVar2 = (*pvVar1->type_id)(), uVar2 != 1)))))))) &&
       (primvar::PrimVar::get_value<tinyusdz::value::normal3d>(local_60,&this->_var),
       local_60[0].has_value_ != false)) {
      dst->z = (double)local_60[0].contained._16_8_;
      dst->x = (double)local_60[0].contained._0_8_;
      dst->y = (double)local_60[0].contained._8_8_;
      local_60[0].has_value_ = true;
    }
    else if ((this->_var)._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (this->_var)._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start) {
      primvar::PrimVar::get_value<tinyusdz::value::normal3d>(local_60,&this->_var);
      if (local_60[0].has_value_ != false) {
        dst->z = (double)local_60[0].contained._16_8_;
        dst->x = (double)local_60[0].contained._0_8_;
        dst->y = (double)local_60[0].contained._8_8_;
      }
    }
    else {
      local_60[0].has_value_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::normal3d>
                     (&this->_var,t,tinterp,dst);
    }
    return local_60[0].has_value_;
  }
  return false;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }